

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

FSerializer * __thiscall
FSerializer::Array<line_t>
          (FSerializer *this,char *key,line_t_conflict *obj,line_t_conflict *def,int count,
          bool fullcompare)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  line_t_conflict *def_00;
  line_t_conflict *plVar4;
  undefined3 in_register_00000089;
  ulong uVar5;
  
  if ((((CONCAT31(in_register_00000089,fullcompare) != 0) && (!save_full)) &&
      (def != (line_t_conflict *)0x0)) &&
     ((this->w != (FWriter *)0x0 && (iVar2 = bcmp(obj,def,(long)count * 0x98), iVar2 == 0)))) {
    return this;
  }
  bVar1 = BeginArray(this,key);
  if (bVar1) {
    if ((this->r != (FReader *)0x0) && (uVar3 = ArraySize(this), (int)uVar3 < count)) {
      count = uVar3;
    }
    if (0 < count) {
      uVar5 = (ulong)(uint)count;
      plVar4 = def;
      do {
        def_00 = plVar4;
        if (def == (line_t_conflict *)0x0) {
          def_00 = def;
        }
        ::Serialize(this,(char *)0x0,obj,def_00);
        plVar4 = plVar4 + 1;
        obj = obj + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, T *def, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && def != nullptr && !memcmp(obj, def, count * sizeof(T)))
		{
			return *this;
		}
		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], def ? &def[i] : nullptr);
			}
			EndArray();
		}
		return *this;
	}